

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall Js::CharArray::DirectSetItemNoSet(CharArray *this,uint32 index,Var value)

{
  bool bVar1;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext;
  Var value_local;
  uint32 index_local;
  CharArray *this_local;
  
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptConversion::ToString(value,scriptContext_00);
  bVar1 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if (!bVar1) {
    return 0;
  }
  JavascriptError::ThrowTypeError(scriptContext_00,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL CharArray::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        ScriptContext* scriptContext = GetScriptContext();
        // A typed array is Integer Indexed Exotic object, so doing a get translates to 9.4.5.9 IntegerIndexedElementSet
        Js::JavascriptConversion::ToString(value, scriptContext);

        if (this->IsDetachedBuffer())
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
        }

        return FALSE;
    }